

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

CollSeq * sqlite3GetCollSeq(Parse *pParse,u8 enc,CollSeq *pColl,char *zName)

{
  byte bVar1;
  sqlite3 *db;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *p_Var2;
  u8 uVar3;
  undefined7 uVar4;
  HashElem *pHVar5;
  char *pcVar6;
  Mem *pMem;
  void *pvVar7;
  CollSeq *pCVar8;
  long lVar9;
  CollSeq *pCVar10;
  
  db = pParse->db;
  if (pColl == (CollSeq *)0x0) {
    if (zName == (char *)0x0) {
      pColl = db->pDfltColl;
LAB_0016e778:
      if (pColl != (CollSeq *)0x0) goto LAB_0016e77d;
    }
    else {
      pHVar5 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
      if (pHVar5->data != (void *)0x0) {
        pColl = (CollSeq *)((long)pHVar5->data + (ulong)enc * 0x28 + -0x28);
        goto LAB_0016e778;
      }
    }
  }
  else {
LAB_0016e77d:
    if (pColl->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
      return pColl;
    }
  }
  if (db->xCollNeeded == (_func_void_void_ptr_sqlite3_ptr_int_char_ptr *)0x0) {
LAB_0016e7d0:
    if (db->xCollNeeded16 != (_func_void_void_ptr_sqlite3_ptr_int_void_ptr *)0x0) {
      pMem = (Mem *)sqlite3DbMallocRawNN(db,0x38);
      if (pMem != (Mem *)0x0) {
        pMem->n = 0;
        pMem->flags = 0;
        pMem->enc = '\0';
        pMem->eSubtype = '\0';
        pMem->db = (sqlite3 *)0x0;
        pMem->szMalloc = 0;
        pMem->uTemp = 0;
        pMem->zMalloc = (char *)0x0;
        (pMem->u).r = 0.0;
        pMem->z = (char *)0x0;
        pMem->xDel = (_func_void_void_ptr *)0x0;
        pMem->flags = 1;
        pMem->db = db;
        sqlite3VdbeMemSetStr(pMem,zName,-1,'\x01',(_func_void_void_ptr *)0x0);
      }
      pvVar7 = sqlite3ValueText(pMem,'\x02');
      if (pvVar7 != (void *)0x0) {
        (*db->xCollNeeded16)(db->pCollNeededArg,db,(int)db->enc,pvVar7);
      }
      sqlite3ValueFree(pMem);
    }
  }
  else {
    pcVar6 = sqlite3DbStrDup(db,zName);
    if (pcVar6 != (char *)0x0) {
      (*db->xCollNeeded)(db->pCollNeededArg,db,(uint)enc,pcVar6);
      sqlite3DbFreeNN(db,pcVar6);
      goto LAB_0016e7d0;
    }
  }
  if (zName == (char *)0x0) {
    pCVar10 = db->pDfltColl;
  }
  else {
    pHVar5 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
    if (pHVar5->data == (void *)0x0) goto LAB_0016e90e;
    pCVar10 = (CollSeq *)((long)pHVar5->data + (ulong)enc * 0x28 + -0x28);
  }
  if (pCVar10 != (CollSeq *)0x0) {
    if (pCVar10->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
      return pCVar10;
    }
    pcVar6 = pCVar10->zName;
    lVar9 = 0;
    do {
      if (pcVar6 == (char *)0x0) {
        pCVar8 = db->pDfltColl;
      }
      else {
        bVar1 = (&synthCollSeq_aEnc)[lVar9];
        pHVar5 = findElementWithHash(&db->aCollSeq,pcVar6,(uint *)0x0);
        pCVar8 = (CollSeq *)((long)pHVar5->data + (ulong)bVar1 * 0x28 + -0x28);
      }
      if (pCVar8->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
        pcVar6 = pCVar8->zName;
        uVar3 = pCVar8->enc;
        uVar4 = *(undefined7 *)&pCVar8->field_0x9;
        p_Var2 = pCVar8->xCmp;
        pCVar10->pUser = pCVar8->pUser;
        pCVar10->xCmp = p_Var2;
        pCVar10->zName = pcVar6;
        pCVar10->enc = uVar3;
        *(undefined7 *)&pCVar10->field_0x9 = uVar4;
        pCVar10->xDel = (_func_void_void_ptr *)0x0;
        return pCVar10;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
  }
LAB_0016e90e:
  sqlite3ErrorMsg(pParse,"no such collation sequence: %s",zName);
  pParse->rc = 0x101;
  return (CollSeq *)0x0;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3GetCollSeq(
  Parse *pParse,        /* Parsing context */
  u8 enc,               /* The desired encoding for the collating sequence */
  CollSeq *pColl,       /* Collating sequence with native encoding, or NULL */
  const char *zName     /* Collating sequence name */
){
  CollSeq *p;
  sqlite3 *db = pParse->db;

  p = pColl;
  if( !p ){
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( !p || !p->xCmp ){
    /* No collation sequence of this type for this encoding is registered.
    ** Call the collation factory to see if it can supply us with one.
    */
    callCollNeeded(db, enc, zName);
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( p && !p->xCmp && synthCollSeq(db, p) ){
    p = 0;
  }
  assert( !p || p->xCmp );
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such collation sequence: %s", zName);
    pParse->rc = SQLITE_ERROR_MISSING_COLLSEQ;
  }
  return p;
}